

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O1

void anon_unknown.dwarf_1714b5::compressUncompress(unsigned_short *raw,int n)

{
  int nCompressed;
  char *compressed;
  unsigned_short *raw_00;
  ulong uVar1;
  ostream *poVar2;
  
  compressed = (char *)operator_new__((ulong)(n * 3 + 0x40000));
  raw_00 = (unsigned_short *)operator_new__((ulong)(uint)n * 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compressing ",0xc);
  std::ostream::flush();
  nCompressed = Imf_2_5::hufCompress(raw,n,compressed);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uncompressing ",0xe);
  std::ostream::flush();
  Imf_2_5::hufUncompress(compressed,nCompressed,raw_00,n);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing: ",0xb);
  std::ostream::flush();
  if (0 < n) {
    uVar1 = 0;
    do {
      if (raw_00[uVar1] != raw[uVar1]) {
        __assert_fail("uncompressed[i] == raw[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testHuf.cpp"
                      ,0x81,
                      "void (anonymous namespace)::compressUncompress(const unsigned short *, int)")
        ;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes, compressed ",0x13);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,nCompressed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  operator_delete__(raw_00);
  operator_delete__(compressed);
  return;
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array <char> compressed (3 * n + 4 * 65536);
    Array <unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
	assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " <<
	    nCompressed  << " bytes" << endl;
}